

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::SimplePathIntegrator::Li
          (SimplePathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *param_5)

{
  Vector3f *pVVar1;
  Normal3f *pNVar2;
  float fVar3;
  undefined8 uVar4;
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  *pTVar5;
  Vector3f woRender;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  Interaction *pIVar20;
  BxDFFlags BVar21;
  undefined8 uVar22;
  bool bVar23;
  byte bVar24;
  ShapeIntersection *pSVar25;
  SampledLight *pSVar26;
  LightLiSample *pLVar27;
  BSDFSample *pBVar28;
  BSDFSample *pBVar29;
  ShapeIntersection *pSVar30;
  LightHandle *light;
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  *this_00;
  type tVar35;
  Point2f PVar37;
  int iVar31;
  int iVar32;
  bool bVar33;
  Float FVar34;
  type tVar36;
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar60 [56];
  undefined1 auVar40 [64];
  ulong uVar59;
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar43 [64];
  undefined1 extraout_var [56];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar61 [56];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 extraout_var_03 [56];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  ulong uVar63;
  undefined1 in_ZMM1 [64];
  Vector3<float> VVar65;
  Vector3f woRender_00;
  Vector3f VVar66;
  SampledSpectrum SVar67;
  SampledSpectrum a;
  SampledSpectrum SVar68;
  anon_class_16_2_2793a994 func;
  Vector3f wiRender;
  undefined1 local_388 [16];
  DispatchSplit<9> local_369;
  ShapeIntersection *local_368;
  ulong uStack_360;
  Tuple3<pbrt::Vector3,_float> local_358;
  SampledSpectrum local_348;
  undefined8 uStack_338;
  undefined8 uStack_330;
  Vector3f wi;
  undefined4 local_30c;
  SampledSpectrum f;
  undefined8 local_2e0;
  undefined1 local_2d0 [16];
  SampledSpectrum *pSStack_2c0;
  undefined4 *puStack_2b8;
  bool *local_2b0;
  Tuple3<pbrt::Vector3,_float> *local_2a8;
  SampledSpectrum L;
  optional<pbrt::LightLiSample> ls;
  ulong uStack_210;
  SampledSpectrum local_1e8;
  optional<pbrt::SampledLight> sampledLight;
  uintptr_t local_1c0;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_1b8;
  BSDF bsdf;
  SampledSpectrum beta;
  optional<pbrt::ShapeIntersection> si;
  undefined1 auVar53 [64];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  float fVar62;
  undefined1 auVar64 [56];
  
  SampledSpectrum::SampledSpectrum(&L,0.0);
  SampledSpectrum::SampledSpectrum(&beta,1.0);
  local_2a8 = &(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>;
  iVar32 = 0;
  local_2b0 = &ray->hasDifferentials;
  bVar24 = 1;
  do {
    bVar23 = SampledSpectrum::operator_cast_to_bool(&beta);
    if (!bVar23) {
      return (SampledSpectrum)(undefined1  [16])L.values.values;
    }
    auVar39 = ZEXT464(0x7f800000);
    Integrator::Intersect(&si,(Integrator *)this,&ray->super_Ray,INFINITY);
    auVar60 = auVar39._8_56_;
    if (si.set == false) {
      if ((this->sampleLights != true) || ((bVar24 & 1) != 0)) {
        this_00 = (TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                   *)(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                     infiniteLights.
                     super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        pTVar5 = *(TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                   **)((long)&(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator
                              .infiniteLights.
                              super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                              ._M_impl.super__Vector_impl_data + 8);
        while( true ) {
          auVar60 = in_ZMM1._8_56_;
          auVar64 = auVar39._8_56_;
          if (this_00 == pTVar5) break;
          func.lambda = lambda;
          func.ray = &ray->super_Ray;
          SVar67 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                   ::
                   Dispatch<pbrt::LightHandle::Le(pbrt::Ray_const&,pbrt::SampledWavelengths_const&)const::_lambda(auto:1)_1_>
                             (this_00,func);
          uVar63 = auVar60._0_8_;
          auVar39._8_56_ = auVar60;
          auVar39._0_8_ = SVar67.values.values._8_8_;
          auVar50._0_8_ = SVar67.values.values._0_8_;
          auVar50._8_56_ = auVar64;
          bsdf._0_16_ = vmovlhps_avx(auVar50._0_16_,auVar39._0_16_);
          uVar59 = bsdf.ng.super_Tuple3<pbrt::Normal3,_float>._0_8_;
          SVar67 = SampledSpectrum::operator*(&beta,(SampledSpectrum *)&bsdf);
          SVar68.values.values._8_8_ = SVar67.values.values._8_8_;
          local_368 = SVar67.values.values._0_8_;
          uStack_360 = uVar59;
          SVar67 = SampledWavelengths::PDF(lambda);
          SVar68.values.values._0_8_ = local_368;
          auVar60 = ZEXT856(uVar63);
          auVar64 = ZEXT856(uStack_360);
          SVar67 = SafeDiv(SVar68,SVar67);
          in_ZMM1._8_56_ = auVar60;
          in_ZMM1._0_8_ = SVar67.values.values._8_8_;
          auVar51._0_8_ = SVar67.values.values._0_8_;
          auVar51._8_56_ = auVar64;
          auVar38 = vmovlhps_avx(auVar51._0_16_,in_ZMM1._0_16_);
          auVar39 = ZEXT1664(auVar38);
          ls.optionalValue._0_4_ = auVar38._0_4_;
          ls.optionalValue._4_4_ = auVar38._4_4_;
          ls.optionalValue._8_4_ = auVar38._8_4_;
          ls.optionalValue._12_4_ = auVar38._12_4_;
          SampledSpectrum::operator+=(&L,(SampledSpectrum *)&ls);
          this_00 = this_00 + 8;
        }
      }
      bVar23 = true;
    }
    else {
      pSVar25 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
      auVar64 = in_ZMM1._8_56_;
      if ((this->sampleLights != true) || ((bVar24 & 1) != 0)) {
        VVar65 = Tuple3<pbrt::Vector3,_float>::operator-(local_2a8);
        SVar67 = SurfaceInteraction::Le
                           (&pSVar25->intr,(Vector3f)VVar65.super_Tuple3<pbrt::Vector3,_float>,
                            lambda);
        uVar63 = auVar64._0_8_;
        auVar9._8_56_ = auVar64;
        auVar9._0_8_ = SVar67.values.values._8_8_;
        auVar40._0_8_ = SVar67.values.values._0_8_;
        auVar40._8_56_ = auVar60;
        bsdf._0_16_ = vmovlhps_avx(auVar40._0_16_,auVar9._0_16_);
        uVar59 = bsdf.ng.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        SVar67 = SampledSpectrum::operator*(&beta,(SampledSpectrum *)&bsdf);
        a.values.values._8_8_ = SVar67.values.values._8_8_;
        local_368 = SVar67.values.values._0_8_;
        uStack_360 = uVar59;
        SVar67 = SampledWavelengths::PDF(lambda);
        a.values.values._0_8_ = local_368;
        auVar60 = ZEXT856(uVar63);
        auVar64 = ZEXT856(uStack_360);
        SVar67 = SafeDiv(a,SVar67);
        in_ZMM1._8_56_ = auVar60;
        in_ZMM1._0_8_ = SVar67.values.values._8_8_;
        auVar41._0_8_ = SVar67.values.values._0_8_;
        auVar41._8_56_ = auVar64;
        auVar38 = vmovlhps_avx(auVar41._0_16_,in_ZMM1._0_16_);
        auVar60 = ZEXT856(auVar38._8_8_);
        ls.optionalValue._0_4_ = auVar38._0_4_;
        ls.optionalValue._4_4_ = auVar38._4_4_;
        ls.optionalValue._8_4_ = auVar38._8_4_;
        ls.optionalValue._12_4_ = auVar38._12_4_;
        SampledSpectrum::operator+=(&L,(SampledSpectrum *)&ls);
      }
      iVar31 = iVar32 + 1;
      bVar23 = true;
      bVar33 = iVar32 != this->maxDepth;
      iVar32 = iVar31;
      local_368 = pSVar25;
      if (bVar33) {
        local_1b8.bits =
             (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
             super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
             .bits;
        local_1c0 = (sampler->
                    super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                    ).bits;
        SurfaceInteraction::GetBSDF
                  (&bsdf,&pSVar25->intr,ray,lambda,(CameraHandle *)&local_1b8,scratchBuffer,
                   (SamplerHandle)&local_1c0);
        if (((undefined1  [16])bsdf._0_16_ & (undefined1  [16])0xffffffffffff) ==
            (undefined1  [16])0x0) {
          pSVar30 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
          SurfaceInteraction::SkipIntersection(&pSVar25->intr,ray,pSVar30->tHit);
          bVar23 = false;
        }
        else {
          VVar65 = Tuple3<pbrt::Vector3,_float>::operator-(local_2a8);
          local_358.z = VVar65.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar42._0_8_ = VVar65.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar42._8_56_ = auVar60;
          local_358._0_8_ = vmovlps_avx(auVar42._0_16_);
          if (this->sampleLights == true) {
            FVar34 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                     ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                               ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                                 *)sampler);
            UniformLightSampler::Sample(&sampledLight,&this->lightSampler,FVar34);
            if (sampledLight.set == true) {
              PVar37 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                       ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                                 ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                                   *)sampler);
              local_388._8_8_ = extraout_XMM0_Qb;
              local_388._0_4_ = PVar37.super_Tuple2<pbrt::Point2,_float>.x;
              local_388._4_4_ = PVar37.super_Tuple2<pbrt::Point2,_float>.y;
              pSVar26 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
              pIVar20 = &(pSVar25->intr).super_Interaction;
              f.values.values[0] =
                   (pIVar20->pi).super_Point3<pbrt::Interval>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
              f.values.values[1] =
                   (pIVar20->pi).super_Point3<pbrt::Interval>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
              f.values.values[2] =
                   (pIVar20->pi).super_Point3<pbrt::Interval>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
              f.values.values[3] =
                   (pIVar20->pi).super_Point3<pbrt::Interval>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
              local_348.values.values = *(array<float,_4> *)(lambda->lambda).values;
              uStack_338 = *(undefined8 *)(lambda->pdf).values;
              uStack_330 = *(undefined8 *)((lambda->pdf).values + 2);
              local_2e0 = (ulong)(uint)(pSVar25->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.
                                       z << 0x20;
              local_30c = 1;
              local_2d0._8_8_ = &wi;
              local_2d0._0_8_ = &f;
              pSStack_2c0 = &local_348;
              puStack_2b8 = &local_30c;
              wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(local_388);
              uVar59 = (pSVar26->light).
                       super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                       .bits;
              local_1e8.values.values[0] = (float)(int)uVar59;
              local_1e8.values.values[1] = (float)(int)(uVar59 >> 0x20);
              DispatchSplit<9>::operator()(&ls,&local_369,&local_1e8,uVar59 >> 0x30);
              if (ls.set == true) {
                pLVar27 = pstd::optional<pbrt::LightLiSample>::value(&ls);
                bVar23 = SampledSpectrum::operator_cast_to_bool(&pLVar27->L);
                if ((bVar23) &&
                   (pLVar27 = pstd::optional<pbrt::LightLiSample>::value(&ls), 0.0 < pLVar27->pdf))
                {
                  pLVar27 = pstd::optional<pbrt::LightLiSample>::value(&ls);
                  wi.super_Tuple3<pbrt::Vector3,_float>.z =
                       (pLVar27->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                  VVar66.super_Tuple3<pbrt::Vector3,_float>.z = local_358.z;
                  VVar66.super_Tuple3<pbrt::Vector3,_float>.x = local_358.x;
                  VVar66.super_Tuple3<pbrt::Vector3,_float>.y = local_358.y;
                  pVVar1 = &pLVar27->wi;
                  wi.super_Tuple3<pbrt::Vector3,_float>.x =
                       (pVVar1->super_Tuple3<pbrt::Vector3,_float>).x;
                  wi.super_Tuple3<pbrt::Vector3,_float>.y =
                       (pVVar1->super_Tuple3<pbrt::Vector3,_float>).y;
                  auVar60 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                  auVar64 = ZEXT856(0);
                  SVar67 = BSDF::f(&bsdf,VVar66,(Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>
                                   ,Radiance);
                  auVar10._8_56_ = auVar60;
                  auVar10._0_8_ = SVar67.values.values._8_8_;
                  auVar43._0_8_ = SVar67.values.values._0_8_;
                  auVar43._8_56_ = auVar64;
                  local_2d0 = vmovlhps_avx(auVar43._0_16_,auVar10._0_16_);
                  tVar35 = AbsDot<float>(&wi,&(pSVar25->intr).shading.n);
                  auVar64 = extraout_var;
                  SVar67 = SampledSpectrum::operator*((SampledSpectrum *)local_2d0,tVar35);
                  auVar11._8_56_ = auVar60;
                  auVar11._0_8_ = SVar67.values.values._8_8_;
                  auVar60 = auVar60._4_56_;
                  auVar44._0_8_ = SVar67.values.values._0_8_;
                  auVar44._8_56_ = auVar64;
                  f.values.values = (array<float,_4>)vmovlhps_avx(auVar44._0_16_,auVar11._0_16_);
                  auVar64 = ZEXT856(f.values.values._8_8_);
                  bVar23 = SampledSpectrum::operator_cast_to_bool(&f);
                  if (bVar23) {
                    pLVar27 = pstd::optional<pbrt::LightLiSample>::value(&ls);
                    bVar23 = Integrator::Unoccluded
                                       ((Integrator *)this,(Interaction *)pSVar25,&pLVar27->pLight);
                    if (bVar23) {
                      SVar67 = SampledSpectrum::operator*(&beta,&f);
                      auVar12._8_56_ = auVar60;
                      auVar12._0_8_ = SVar67.values.values._8_8_;
                      auVar45._0_8_ = SVar67.values.values._0_8_;
                      auVar45._8_56_ = auVar64;
                      local_348.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar45._0_16_,auVar12._0_16_);
                      uVar59 = local_348.values.values._8_8_;
                      pLVar27 = pstd::optional<pbrt::LightLiSample>::value(&ls);
                      SVar67 = SampledSpectrum::operator*(&local_348,&pLVar27->L);
                      auVar64 = auVar60;
                      pSVar26 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
                      fVar62 = pSVar26->pdf;
                      pLVar27 = pstd::optional<pbrt::LightLiSample>::value(&ls);
                      fVar3 = pLVar27->pdf;
                      auVar61 = (undefined1  [56])0x0;
                      SVar68 = SampledWavelengths::PDF(lambda);
                      auVar13._8_56_ = auVar64;
                      auVar13._0_8_ = SVar68.values.values._8_8_;
                      auVar46._0_8_ = SVar68.values.values._0_8_;
                      auVar46._8_56_ = auVar61;
                      local_1e8.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar46._0_16_,auVar13._0_16_);
                      SVar68 = SampledSpectrum::operator*(&local_1e8,fVar3 * fVar62);
                      uStack_210 = auVar60._0_8_;
                      auVar60 = ZEXT856(uStack_210);
                      auVar64 = ZEXT856(uVar59);
                      SVar67 = SafeDiv(SVar67,SVar68);
                      auVar14._8_56_ = auVar60;
                      auVar14._0_8_ = SVar67.values.values._8_8_;
                      auVar47._0_8_ = SVar67.values.values._0_8_;
                      auVar47._8_56_ = auVar64;
                      local_2d0 = vmovlhps_avx(auVar47._0_16_,auVar14._0_16_);
                      SampledSpectrum::operator+=(&L,(SampledSpectrum *)local_2d0);
                    }
                  }
                }
              }
              pstd::optional<pbrt::LightLiSample>::~optional(&ls);
            }
            pstd::optional<pbrt::SampledLight>::~optional(&sampledLight);
          }
          if (this->sampleBSDF == true) {
            FVar34 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                     ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                               ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                                 *)sampler);
            fVar62 = local_358.z;
            uVar4 = local_358._0_8_;
            PVar37 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                     ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                               ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                                 *)sampler);
            uVar22 = local_358._0_8_;
            woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar62;
            local_358.x = (float)uVar4;
            local_358.y = SUB84(uVar4,4);
            woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = local_358.x;
            woRender_00.super_Tuple3<pbrt::Vector3,_float>.y = local_358.y;
            auVar39 = ZEXT6064((undefined1  [60])0x0) << 0x20;
            iVar31 = 3;
            local_358._0_8_ = uVar22;
            BSDF::Sample_f((optional<pbrt::BSDFSample> *)&f,&bsdf,woRender_00,FVar34,PVar37,Radiance
                           ,All);
            auVar60 = auVar39._8_56_;
            auVar38 = auVar39._0_16_;
            if (local_2e0._4_1_ != false) {
              pBVar28 = pstd::optional<pbrt::BSDFSample>::value((optional<pbrt::BSDFSample> *)&f);
              pBVar29 = pstd::optional<pbrt::BSDFSample>::value((optional<pbrt::BSDFSample> *)&f);
              tVar35 = AbsDot<float>(&pBVar29->wi,&(local_368->intr).shading.n);
              auVar64 = extraout_var_00;
              SVar67 = SampledSpectrum::operator*(&pBVar28->f,tVar35);
              auVar15._8_56_ = auVar60;
              auVar15._0_8_ = SVar67.values.values._8_8_;
              auVar48._0_8_ = SVar67.values.values._0_8_;
              auVar48._8_56_ = auVar64;
              local_2d0 = vmovlhps_avx(auVar48._0_16_,auVar15._0_16_);
              pBVar28 = pstd::optional<pbrt::BSDFSample>::value((optional<pbrt::BSDFSample> *)&f);
              auVar64 = (undefined1  [56])0x0;
              SVar67 = SampledSpectrum::operator/((SampledSpectrum *)local_2d0,pBVar28->pdf);
              auVar16._8_56_ = auVar60;
              auVar16._0_8_ = SVar67.values.values._8_8_;
              auVar49._0_8_ = SVar67.values.values._0_8_;
              auVar49._8_56_ = auVar64;
              auVar38 = vmovlhps_avx(auVar49._0_16_,auVar16._0_16_);
              ls.optionalValue._0_4_ = auVar38._0_4_;
              ls.optionalValue._4_4_ = auVar38._4_4_;
              ls.optionalValue._8_4_ = auVar38._8_4_;
              ls.optionalValue._12_4_ = auVar38._12_4_;
              SampledSpectrum::operator*=(&beta,(SampledSpectrum *)&ls);
              pBVar28 = pstd::optional<pbrt::BSDFSample>::value((optional<pbrt::BSDFSample> *)&f);
              BVar21 = pBVar28->flags;
              pBVar28 = pstd::optional<pbrt::BSDFSample>::value((optional<pbrt::BSDFSample> *)&f);
              Interaction::SpawnRay((RayDifferential *)&ls,(Interaction *)local_368,&pBVar28->wi);
              iVar31 = 0;
              bVar24 = (byte)(char)BVar21 >> 4;
              (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x =
                   (float)ls.optionalValue._12_4_;
              (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
                   (float)ls.optionalValue._16_4_;
              *(undefined8 *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
                   ls.optionalValue._20_8_;
              (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)ls.optionalValue._0_4_
              ;
              (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y = (float)ls.optionalValue._4_4_
              ;
              *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
                   CONCAT44(ls.optionalValue._12_4_,ls.optionalValue._8_4_);
              (ray->super_Ray).medium.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              .bits = ls.optionalValue._32_8_;
              auVar6._4_8_ = ls.optionalValue._64_8_;
              auVar6._0_4_ = ls.optionalValue._60_4_;
              auVar6._12_20_ = ls.optionalValue._72_20_;
              auVar38 = auVar6._0_16_;
              *(undefined1 (*) [32])(local_2b0 + 0x14) = auVar6;
              *(undefined8 *)local_2b0 = ls.optionalValue._40_8_;
              *(undefined8 *)(local_2b0 + 8) = ls.optionalValue._48_8_;
              (((Point3f *)(local_2b0 + 0x10))->super_Tuple3<pbrt::Point3,_float>).x =
                   (float)ls.optionalValue._56_4_;
              (((Point3f *)(local_2b0 + 0x10))->super_Tuple3<pbrt::Point3,_float>).y =
                   (float)ls.optionalValue._60_4_;
              *(undefined8 *)(local_2b0 + 0x18) = ls.optionalValue._64_8_;
            }
            in_ZMM1 = ZEXT1664(auVar38);
            pstd::optional<pbrt::BSDFSample>::~optional((optional<pbrt::BSDFSample> *)&f);
            auVar38 = in_ZMM1._0_16_;
            if (local_2e0._4_1_ != false) goto LAB_003c5c2a;
          }
          else {
            local_348.values.values._0_12_ = ZEXT812(0);
            bVar23 = BSDF::HasReflection(&bsdf);
            if ((bVar23) && (bVar23 = BSDF::HasTransmission(&bsdf), bVar23)) {
              auVar52._0_8_ =
                   TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                   ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                               *)sampler);
              auVar52._8_56_ = extraout_var_01;
              uVar4 = vmovlps_avx(auVar52._0_16_);
              ls.optionalValue._0_4_ = (undefined4)uVar4;
              ls.optionalValue._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
              auVar60 = extraout_var_01;
              VVar66 = SampleUniformSphere((Point2f *)&ls);
              fVar62 = VVar66.super_Tuple3<pbrt::Vector3,_float>.z;
              auVar53._0_8_ = VVar66.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              auVar53._8_56_ = auVar60;
              uVar4 = vmovlps_avx(auVar53._0_16_);
              FVar34 = 0.07957747;
              local_348.values.values[2] = fVar62;
              local_348.values.values[0] = (float)(int)uVar4;
              local_348.values.values[1] = (float)(int)((ulong)uVar4 >> 0x20);
            }
            else {
              auVar54._0_8_ =
                   TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                   ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                               *)sampler);
              auVar54._8_56_ = extraout_var_02;
              uVar4 = vmovlps_avx(auVar54._0_16_);
              ls.optionalValue._0_4_ = (undefined4)uVar4;
              ls.optionalValue._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
              auVar60 = extraout_var_02;
              VVar66 = SampleUniformHemisphere((Point2f *)&ls);
              auVar55._0_8_ = VVar66.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              auVar55._8_56_ = auVar60;
              uVar4 = vmovlps_avx(auVar55._0_16_);
              local_348.values.values[2] = VVar66.super_Tuple3<pbrt::Vector3,_float>.z;
              local_348.values.values[0] = (float)(int)uVar4;
              local_348.values.values[1] = (float)(int)((ulong)uVar4 >> 0x20);
              bVar23 = BSDF::HasReflection(&bsdf);
              if (bVar23) {
                pNVar2 = &(local_368->intr).super_Interaction.n;
                tVar35 = Dot<float>((Vector3<float> *)&local_358,pNVar2);
                tVar36 = Dot<float>((Vector3<float> *)&local_348,pNVar2);
                if (0.0 <= tVar36 * tVar35) goto LAB_003c5aaa;
LAB_003c5b11:
                auVar38._0_8_ = local_348.values.values._0_8_ ^ 0x8000000080000000;
                auVar38._8_4_ = 0x80000000;
                local_348.values.values[2] = -local_348.values.values[2];
                auVar38._12_4_ = 0x80000000;
                uVar4 = vmovlps_avx(auVar38);
                local_348.values.values[0] = (float)(int)uVar4;
                local_348.values.values[1] = (float)(int)((ulong)uVar4 >> 0x20);
                fVar62 = local_348.values.values[2];
              }
              else {
LAB_003c5aaa:
                bVar23 = BSDF::HasTransmission(&bsdf);
                if (bVar23) {
                  pNVar2 = &(local_368->intr).super_Interaction.n;
                  tVar35 = Dot<float>((Vector3<float> *)&local_358,pNVar2);
                  tVar36 = Dot<float>((Vector3<float> *)&local_348,pNVar2);
                  fVar62 = local_348.values.values[2];
                  if (0.0 < tVar36 * tVar35) {
                    goto LAB_003c5b11;
                  }
                }
                else {
                  fVar62 = local_348.values.values[2];
                }
              }
              FVar34 = 0.15915494;
            }
            SVar67.values.values = local_348.values.values;
            pSVar25 = local_368;
            woRender.super_Tuple3<pbrt::Vector3,_float>.z = local_358.z;
            woRender.super_Tuple3<pbrt::Vector3,_float>.x = local_358.x;
            woRender.super_Tuple3<pbrt::Vector3,_float>.y = local_358.y;
            auVar60 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
            auVar64 = ZEXT856(0);
            wiRender.super_Tuple3<pbrt::Vector3,_float>.z = fVar62;
            wiRender.super_Tuple3<pbrt::Vector3,_float>.x = local_348.values.values[0];
            wiRender.super_Tuple3<pbrt::Vector3,_float>.y = local_348.values.values[1];
            local_348.values.values = SVar67.values.values;
            SVar67 = BSDF::f(&bsdf,woRender,wiRender,Radiance);
            auVar17._8_56_ = auVar60;
            auVar17._0_8_ = SVar67.values.values._8_8_;
            auVar56._0_8_ = SVar67.values.values._0_8_;
            auVar56._8_56_ = auVar64;
            local_2d0 = vmovlhps_avx(auVar56._0_16_,auVar17._0_16_);
            tVar35 = AbsDot<float>((Vector3<float> *)&local_348,&(pSVar25->intr).shading.n);
            auVar64 = extraout_var_03;
            SVar67 = SampledSpectrum::operator*((SampledSpectrum *)local_2d0,tVar35);
            auVar18._8_56_ = auVar60;
            auVar18._0_8_ = SVar67.values.values._8_8_;
            auVar57._0_8_ = SVar67.values.values._0_8_;
            auVar57._8_56_ = auVar64;
            f.values.values = (array<float,_4>)vmovlhps_avx(auVar57._0_16_,auVar18._0_16_);
            auVar64 = (undefined1  [56])0x0;
            SVar67 = SampledSpectrum::operator/(&f,FVar34);
            auVar19._8_56_ = auVar60;
            auVar19._0_8_ = SVar67.values.values._8_8_;
            auVar58._0_8_ = SVar67.values.values._0_8_;
            auVar58._8_56_ = auVar64;
            auVar38 = vmovlhps_avx(auVar58._0_16_,auVar19._0_16_);
            ls.optionalValue._0_4_ = auVar38._0_4_;
            ls.optionalValue._4_4_ = auVar38._4_4_;
            ls.optionalValue._8_4_ = auVar38._8_4_;
            ls.optionalValue._12_4_ = auVar38._12_4_;
            SampledSpectrum::operator*=(&beta,(SampledSpectrum *)&ls);
            Interaction::SpawnRay
                      ((RayDifferential *)&ls,(Interaction *)pSVar25,(Vector3f *)&local_348);
            bVar24 = 0;
            (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)ls.optionalValue._12_4_
            ;
            (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y = (float)ls.optionalValue._16_4_
            ;
            *(undefined8 *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
                 ls.optionalValue._20_8_;
            (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)ls.optionalValue._0_4_;
            (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y = (float)ls.optionalValue._4_4_;
            *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
                 CONCAT44(ls.optionalValue._12_4_,ls.optionalValue._8_4_);
            (ray->super_Ray).medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = ls.optionalValue._32_8_;
            auVar7._4_8_ = ls.optionalValue._64_8_;
            auVar7._0_4_ = ls.optionalValue._60_4_;
            auVar7._12_20_ = ls.optionalValue._72_20_;
            auVar38 = auVar7._0_16_;
            *(undefined1 (*) [32])(local_2b0 + 0x14) = auVar7;
            *(undefined8 *)local_2b0 = ls.optionalValue._40_8_;
            *(undefined8 *)(local_2b0 + 8) = ls.optionalValue._48_8_;
            (((Point3f *)(local_2b0 + 0x10))->super_Tuple3<pbrt::Point3,_float>).x =
                 (float)ls.optionalValue._56_4_;
            (((Point3f *)(local_2b0 + 0x10))->super_Tuple3<pbrt::Point3,_float>).y =
                 (float)ls.optionalValue._60_4_;
            *(undefined8 *)(local_2b0 + 0x18) = ls.optionalValue._64_8_;
LAB_003c5c2a:
            in_ZMM1 = ZEXT1664(auVar38);
            ls.optionalValue._0_4_ = SampledSpectrum::y(&beta,lambda);
            auVar8._12_4_ = 0;
            auVar8._0_4_ = f.values.values[1];
            auVar8._4_4_ = f.values.values[2];
            auVar8._8_4_ = f.values.values[3];
            f.values.values = (array<float,_4>)(auVar8 << 0x20);
            if ((float)ls.optionalValue._0_4_ < 0.0) {
              LogFatal<char_const(&)[15],char_const(&)[4],char_const(&)[15],float&,char_const(&)[4],float&>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.cpp"
                         ,0x1e4,"Check failed: %s >= %s with %s = %s, %s = %s",
                         (char (*) [15])"beta.y(lambda)",(char (*) [4])"0.f",
                         (char (*) [15])"beta.y(lambda)",(float *)&ls,(char (*) [4])"0.f",
                         (float *)&f);
            }
            iVar31 = 0;
          }
          bVar23 = iVar31 == 3;
        }
      }
    }
    pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
    if (bVar23) {
      return (SampledSpectrum)L.values;
    }
  } while( true );
}

Assistant:

SampledSpectrum SimplePathIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                         SamplerHandle sampler,
                                         ScratchBuffer &scratchBuffer,
                                         VisibleSurface *) const {
    // Estimate radiance along ray using simple path tracing
    SampledSpectrum L(0.f), beta(1.f);
    bool specularBounce = true;
    int depth = 0;
    while (beta) {
        // Find next _SimplePathIntegrator_ path vertex and accumulate contribution
        // Intersect _ray_ with scene
        pstd::optional<ShapeIntersection> si = Intersect(ray);

        // Account for infinite lights if ray has no intersection
        if (!si) {
            if (!sampleLights || specularBounce)
                for (const auto &light : infiniteLights)
                    L += SafeDiv(beta * light.Le(ray, lambda), lambda.PDF());
            break;
        }

        // Account for emsisive surface if light wasn't sampled
        SurfaceInteraction &isect = si->intr;
        if (!sampleLights || specularBounce)
            L += SafeDiv(beta * isect.Le(-ray.d, lambda), lambda.PDF());

        // End path if maximum depth reached
        if (depth++ == maxDepth)
            break;

        // Get BSDF and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        // Sample direct illumination if _sampleLights_ is true
        Vector3f wo = -ray.d;
        if (sampleLights) {
            pstd::optional<SampledLight> sampledLight =
                lightSampler.Sample(sampler.Get1D());
            if (sampledLight) {
                // Sample point on _sampledLight_ to estimate direct illumination
                Point2f uLight = sampler.Get2D();
                pstd::optional<LightLiSample> ls =
                    sampledLight->light.SampleLi(isect, uLight, lambda);
                if (ls && ls->L && ls->pdf > 0) {
                    // Evaluate BSDF for light and possibly add scattered radiance
                    Vector3f wi = ls->wi;
                    SampledSpectrum f = bsdf.f(wo, wi) * AbsDot(wi, isect.shading.n);
                    if (f && Unoccluded(isect, ls->pLight))
                        L += SafeDiv(beta * f * ls->L,
                                     sampledLight->pdf * ls->pdf * lambda.PDF());
                }
            }
        }

        // Sample outoing direction at intersection to continue path
        if (sampleBSDF) {
            // Sample BSDF for new path direction
            Float u = sampler.Get1D();
            pstd::optional<BSDFSample> bs = bsdf.Sample_f(wo, u, sampler.Get2D());
            if (!bs)
                break;
            beta *= bs->f * AbsDot(bs->wi, isect.shading.n) / bs->pdf;
            specularBounce = bs->IsSpecular();
            ray = isect.SpawnRay(bs->wi);

        } else {
            // Uniformly sample sphere or hemisphere to get new path direction
            Float pdf;
            Vector3f wi;
            if (bsdf.HasReflection() && bsdf.HasTransmission()) {
                wi = SampleUniformSphere(sampler.Get2D());
                pdf = UniformSpherePDF();
            } else {
                wi = SampleUniformHemisphere(sampler.Get2D());
                pdf = UniformHemispherePDF();
                if (bsdf.HasReflection() && Dot(wo, isect.n) * Dot(wi, isect.n) < 0)
                    wi = -wi;
                else if (bsdf.HasTransmission() &&
                         Dot(wo, isect.n) * Dot(wi, isect.n) > 0)
                    wi = -wi;
            }
            beta *= bsdf.f(wo, wi) * AbsDot(wi, isect.shading.n) / pdf;
            specularBounce = false;
            ray = isect.SpawnRay(wi);
        }

        CHECK_GE(beta.y(lambda), 0.f);
        DCHECK(!IsInf(beta.y(lambda)));
    }
    return L;
}